

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O0

void __thiscall
blc::network::Socket::Socket(Socket *this,string *address,int port,bool block,int mode,int type)

{
  byte in_CL;
  undefined4 in_EDX;
  string *in_RSI;
  stream *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  
  stream::stream(in_RDI);
  in_RDI->_vptr_stream = (_func_int **)&PTR_write_00130b88;
  *(undefined4 *)&in_RDI[1]._vptr_stream = 0;
  std::__cxx11::string::string((string *)(in_RDI + 2),in_RSI);
  *(undefined4 *)&in_RDI[6]._vptr_stream = in_EDX;
  *(byte *)((long)&in_RDI[6]._vptr_stream + 4) = in_CL & 1;
  *(undefined4 *)&in_RDI[7]._vptr_stream = in_R8D;
  *(undefined4 *)((long)&in_RDI[7]._vptr_stream + 4) = in_R9D;
  *(undefined1 *)&in_RDI[8]._vptr_stream = 0;
  return;
}

Assistant:

blc::network::Socket::Socket(std::string address, int port, bool block, int mode, int type) :	_socket(0),
												_address(address),
												_port(port),
												_block(block),
												_mode(mode),
												_type(type),
												_opened(false) {
}